

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rans_symbol_decoder.h
# Opt level: O2

bool __thiscall
draco::RAnsSymbolDecoder<10>::StartDecoding(RAnsSymbolDecoder<10> *this,DecoderBuffer *buffer)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  ulong in_RAX;
  uint64_t bytes_encoded;
  ulong local_18;
  
  local_18 = in_RAX;
  if (buffer->bitstream_version_ < 0x200) {
    bVar2 = DecoderBuffer::Decode<unsigned_long>(buffer,&local_18);
  }
  else {
    bVar2 = DecodeVarint<unsigned_long>(&local_18,buffer);
  }
  if ((bVar2 != false) && (lVar1 = buffer->pos_, local_18 <= (ulong)(buffer->data_size_ - lVar1))) {
    buffer->pos_ = lVar1 + local_18;
    iVar3 = RAnsDecoder<15>::read_init(&this->ans_,(uint8_t *)(buffer->data_ + lVar1),(int)local_18)
    ;
    return iVar3 == 0;
  }
  return false;
}

Assistant:

bool RAnsSymbolDecoder<unique_symbols_bit_length_t>::StartDecoding(
    DecoderBuffer *buffer) {
  uint64_t bytes_encoded;
  // Decode the number of bytes encoded by the encoder.
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (buffer->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 0)) {
    if (!buffer->Decode(&bytes_encoded)) {
      return false;
    }

  } else
#endif
  {
    if (!DecodeVarint<uint64_t>(&bytes_encoded, buffer)) {
      return false;
    }
  }
  if (bytes_encoded > static_cast<uint64_t>(buffer->remaining_size())) {
    return false;
  }
  const uint8_t *const data_head =
      reinterpret_cast<const uint8_t *>(buffer->data_head());
  // Advance the buffer past the rANS data.
  buffer->Advance(bytes_encoded);
  if (ans_.read_init(data_head, static_cast<int>(bytes_encoded)) != 0) {
    return false;
  }
  return true;
}